

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O1

int Saig_ManCexVerifyUsingTernary(Aig_Man_t *pAig,Abc_Cex_t *pCex,Abc_Cex_t *pCare)

{
  void *pvVar1;
  Aig_Obj_t *pObj;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  
  if (pCex->iFrame != pCare->iFrame) {
    __assert_fail("pCex->iFrame == pCare->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28b,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  if (pCex->nBits != pCare->nBits) {
    __assert_fail("pCex->nBits == pCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28c,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  if (pAig->nTruePos <= pCex->iPo) {
    __assert_fail("pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28d,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  *(ulong *)&pAig->pConst1->field_0x18 =
       *(ulong *)&pAig->pConst1->field_0x18 & 0xffffffffffffffcf | 0x20;
  if (0 < pAig->nRegs) {
    iVar4 = 0;
    do {
      uVar7 = pAig->nTruePis + iVar4;
      if (((int)uVar7 < 0) || (pAig->vCis->nSize <= (int)uVar7)) goto LAB_00607cf1;
      if ((pCex[1].iPo & 1) != 0) {
        __assert_fail("!Abc_InfoHasBit(pCex->pData, iBit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                      ,0x292,
                      "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
      }
      if ((pCare[1].iPo & 1) != 0) {
        __assert_fail("!Abc_InfoHasBit(pCare->pData, iBit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                      ,0x293,
                      "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
      }
      pvVar1 = pAig->vCis->pArray[uVar7];
      *(ulong *)((long)pvVar1 + 0x18) = *(ulong *)((long)pvVar1 + 0x18) & 0xffffffffffffffcf | 0x10;
      iVar4 = iVar4 + 1;
    } while (iVar4 < pAig->nRegs);
  }
  iVar4 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar12 = 0;
    do {
      if (0 < pAig->nTruePis) {
        lVar5 = 0;
        do {
          if (pAig->vCis->nSize <= lVar5) goto LAB_00607cf1;
          uVar7 = iVar4 + (int)lVar5;
          pvVar1 = pAig->vCis->pArray[lVar5];
          iVar10 = (int)uVar7 >> 5;
          uVar7 = uVar7 & 0x1f;
          if (((uint)(&pCare[1].iPo)[iVar10] >> uVar7 & 1) == 0) {
            *(byte *)((long)pvVar1 + 0x18) = *(byte *)((long)pvVar1 + 0x18) | 0x30;
          }
          else {
            uVar11 = *(ulong *)((long)pvVar1 + 0x18) & 0xffffffffffffffcf;
            if (((uint)(&pCex[1].iPo)[iVar10] >> uVar7 & 1) == 0) {
              uVar11 = uVar11 | 0x10;
            }
            else {
              uVar11 = uVar11 | 0x20;
            }
            *(ulong *)((long)pvVar1 + 0x18) = uVar11;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < pAig->nTruePis);
        iVar4 = iVar4 + (int)lVar5;
      }
      pVVar6 = pAig->vObjs;
      if (0 < pVVar6->nSize) {
        lVar5 = 0;
        do {
          pObj = (Aig_Obj_t *)pVVar6->pArray[lVar5];
          if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
            Saig_ObjCexMinSim(pObj);
          }
          lVar5 = lVar5 + 1;
          pVVar6 = pAig->vObjs;
        } while (lVar5 < pVVar6->nSize);
      }
      pVVar6 = pAig->vCos;
      if (0 < pVVar6->nSize) {
        lVar5 = 0;
        do {
          Saig_ObjCexMinSim((Aig_Obj_t *)pVVar6->pArray[lVar5]);
          lVar5 = lVar5 + 1;
          pVVar6 = pAig->vCos;
        } while (lVar5 < pVVar6->nSize);
      }
      if (0 < pAig->nRegs) {
        iVar10 = 0;
        do {
          uVar7 = pAig->nTruePos + iVar10;
          if (((((int)uVar7 < 0) || (pAig->vCos->nSize <= (int)uVar7)) ||
              (uVar8 = pAig->nTruePis + iVar10, (int)uVar8 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar8)) goto LAB_00607cf1;
          pvVar1 = pAig->vCos->pArray[uVar7];
          pvVar2 = pAig->vCis->pArray[uVar8];
          uVar9 = (ulong)((uint)*(undefined8 *)((long)pvVar1 + 0x18) & 0x10);
          uVar11 = *(ulong *)((long)pvVar2 + 0x18);
          *(ulong *)((long)pvVar2 + 0x18) = uVar11 & 0xffffffffffffffef | uVar9;
          *(ulong *)((long)pvVar2 + 0x18) =
               uVar11 & 0xffffffffffffffcf | uVar9 |
               (ulong)((uint)*(undefined8 *)((long)pvVar1 + 0x18) & 0x20);
          iVar10 = iVar10 + 1;
        } while (iVar10 < pAig->nRegs);
      }
      bVar3 = iVar12 < pCex->iFrame;
      iVar12 = iVar12 + 1;
    } while (bVar3);
  }
  if (iVar4 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x2bd,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  iVar4 = pCex->iPo;
  if ((-1 < (long)iVar4) && (iVar4 < pAig->vCos->nSize)) {
    uVar11 = *(ulong *)((long)pAig->vCos->pArray[iVar4] + 0x18);
    return (uint)((uVar11 & 0x10) == 0) & (uint)(uVar11 >> 5) & 0x7ffffff;
  }
LAB_00607cf1:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManCexVerifyUsingTernary( Aig_Man_t * pAig, Abc_Cex_t * pCex, Abc_Cex_t * pCare )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f, iBit = 0;
    assert( pCex->iFrame == pCare->iFrame );
    assert( pCex->nBits  == pCare->nBits );
    assert( pCex->iPo < Saig_ManPoNum(pAig) );
    Saig_ObjCexMinSet1( Aig_ManConst1(pAig) );
    // set flops to the init state
    Saig_ManForEachLo( pAig, pObj, i )
    {
        assert( !Abc_InfoHasBit(pCex->pData, iBit) );
        assert( !Abc_InfoHasBit(pCare->pData, iBit) );
//        if ( Abc_InfoHasBit(pCare->pData, iBit++) )
            Saig_ObjCexMinSet0( pObj );
//        else
//            Saig_ObjCexMinSetX( pObj );
    }
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // init inputs
        Saig_ManForEachPi( pAig, pObj, i )
        {
            if ( Abc_InfoHasBit(pCare->pData, iBit++) )
            {
                if ( Abc_InfoHasBit(pCex->pData, iBit-1) )
                    Saig_ObjCexMinSet1( pObj );
                else
                    Saig_ObjCexMinSet0( pObj );
            }
            else
                Saig_ObjCexMinSetX( pObj );
        }
        // simulate internal nodes
        Aig_ManForEachNode( pAig, pObj, i )
            Saig_ObjCexMinSim( pObj );
        // simulate COs
        Aig_ManForEachCo( pAig, pObj, i )
            Saig_ObjCexMinSim( pObj );
/*
        Aig_ManForEachObj( pAig, pObj, i )
        {
            Aig_ObjPrint(pAig, pObj);
            printf( "  Value = " );
            Saig_ObjCexMinPrint( pObj );
            printf( "\n" );
        }
*/
        // transfer
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, i )
            pObjRo->fMarkA = pObjRi->fMarkA,
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == pCex->nBits );
    return Saig_ObjCexMinGet1( Aig_ManCo( pAig, pCex->iPo ) );
}